

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampParameterTextureBorderColor.cpp
# Opt level: O3

bool __thiscall
glcts::TextureBorderClampParameterTextureBorderColor::verifyGLGetSamplerParameterIivResult
          (TextureBorderClampParameterTextureBorderColor *this,GLuint sampler_id,GLenum target,
          GLint *expected_data)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  deUint32 err;
  int *piVar4;
  undefined4 extraout_var;
  ulong uVar5;
  ostream *poVar6;
  char *__s;
  size_t sVar7;
  value_type_conflict1 *__val;
  GLuint j;
  long lVar8;
  bool bVar9;
  stringstream returnedDataStream;
  stringstream expectedDataStream;
  long *local_500;
  long local_4f8;
  long local_4f0 [2];
  long *local_4e0;
  long local_4d8;
  long local_4d0 [2];
  undefined1 local_4c0 [8];
  _func_int **local_4b8;
  ios_base local_448 [264];
  stringstream local_340 [16];
  undefined1 local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base aiStack_138 [264];
  
  piVar4 = (int *)operator_new(0x10);
  piVar4[0] = 0;
  piVar4[1] = 0;
  piVar4[2] = 0;
  piVar4[3] = 0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  iVar3 = (*((this->super_TextureBorderClampBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  piVar4[0] = 0;
  piVar4[1] = 0;
  piVar4[2] = 0;
  piVar4[3] = 0;
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0xa38))
            (sampler_id,
             (this->super_TextureBorderClampBase).super_TestCaseBase.m_glExtTokens.
             TEXTURE_BORDER_COLOR,piVar4);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"Error getting  parameter for sampler.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampParameterTextureBorderColor.cpp"
                  ,0x203);
  if (*expected_data == *piVar4) {
    uVar5 = 0xffffffffffffffff;
    do {
      if (uVar5 == 2) {
        bVar9 = true;
        goto LAB_00d52a85;
      }
      lVar8 = uVar5 + 2;
      uVar1 = uVar5 + 1;
      lVar2 = uVar5 + 2;
      uVar5 = uVar1;
    } while (expected_data[lVar8] == piVar4[lVar2]);
    bVar9 = 2 < uVar1;
  }
  else {
    bVar9 = false;
  }
  lVar8 = 0;
  do {
    poVar6 = (ostream *)std::ostream::operator<<(local_1a8,expected_data[lVar8]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = (ostream *)std::ostream::operator<<(local_330,piVar4[lVar8]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  local_4c0 = (undefined1  [8])
              ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.super_TestNode
              .m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_4b8,
             "Wrong value encountered when calling glGetSamplerParameterIivEXT() with GL_TEXTURE_BORDER_COLOR_EXT pname;"
             ,0x6a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8," texture target:",0x10);
  __s = TextureBorderClampBase::getTexTargetString(&this->super_TextureBorderClampBase,target);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_4b8 + (int)local_4b8[-3]);
  }
  else {
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,__s,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_4b8," expected values:[",0x12);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_4b8,(char *)local_4e0,local_4d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8," result values:[",0x10);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_4b8,(char *)local_500,local_4f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,"]\n",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_500 != local_4f0) {
    operator_delete(local_500,local_4f0[0] + 1);
  }
  if (local_4e0 != local_4d0) {
    operator_delete(local_4e0,local_4d0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4b8);
  std::ios_base::~ios_base(local_448);
LAB_00d52a85:
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  operator_delete(piVar4,0x10);
  return bVar9;
}

Assistant:

bool TextureBorderClampParameterTextureBorderColor::verifyGLGetSamplerParameterIivResult(
	glw::GLuint sampler_id, glw::GLenum target, const glw::GLint* expected_data)
{
	std::vector<glw::GLint> buffer(m_buffer_length);
	std::stringstream		expectedDataStream;
	std::stringstream		returnedDataStream;
	const glw::Functions&   gl = m_context.getRenderContext().getFunctions();

	memset(&buffer[0], 0, m_buffer_length * sizeof(glw::GLint));

	gl.getSamplerParameterIiv(sampler_id, m_glExtTokens.TEXTURE_BORDER_COLOR, &buffer[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting  parameter for sampler.");

	for (glw::GLuint i = 0; i < m_buffer_length; ++i)
	{
		if (expected_data[i] != buffer[i])
		{
			for (glw::GLuint j = 0; j < m_buffer_length; ++j)
			{
				expectedDataStream << expected_data[j] << ",";
				returnedDataStream << buffer[j] << ",";
			}
			getTestContext().getLog() << tcu::TestLog::Message
									  << "Wrong value encountered when calling glGetSamplerParameterIivEXT() with "
										 "GL_TEXTURE_BORDER_COLOR_EXT pname;"
									  << " texture target:" << getTexTargetString(target) << "\n"
									  << " expected values:[" << expectedDataStream.str() << "]"
									  << " result values:[" << returnedDataStream.str() << "]\n"
									  << tcu::TestLog::EndMessage;
			return false;
		}
	}
	return true;
}